

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlackCard.cpp
# Opt level: O0

void __thiscall BlackCard::PrintCardStats(BlackCard *this)

{
  Holding *hold;
  Personality *pers;
  BlackCard *this_local;
  
  if (this->type == PERSONALITY) {
    Personality::PrintPersonality((Personality *)this);
  }
  else {
    if (this->type != HOLDING) {
      exit(-1);
    }
    Holding::PrintHolding((Holding *)this);
  }
  return;
}

Assistant:

void BlackCard::PrintCardStats()                                //defines type of card and calls proper print function for that type
{
    if (type == PERSONALITY)
    {
        Personality* pers = reinterpret_cast<Personality*>(this);
        pers->PrintPersonality();

        pers = nullptr;
        delete pers;
    }
    else if (type == HOLDING)
    {
        Holding * hold = reinterpret_cast<Holding*>(this);
        hold->PrintHolding();

        hold = nullptr;
        delete hold;
    }
    else
        exit(-1);
}